

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascon_aead80pq.c
# Opt level: O0

void ascon_aead80pq_encrypt
               (uint8_t *ciphertext,uint8_t *tag,uint8_t *key,uint8_t *nonce,uint8_t *assoc_data,
               uint8_t *plaintext,size_t assoc_data_len,size_t plaintext_len,size_t tag_len)

{
  uint8_t *tag_00;
  size_t new_ct_bytes;
  ascon_aead_ctx_t ctx;
  uint8_t *in_stack_ffffffffffffff68;
  ascon_aead_ctx_t *in_stack_ffffffffffffff70;
  uint8_t *in_stack_ffffffffffffff78;
  ascon_aead_ctx_t *in_stack_ffffffffffffff80;
  
  ascon_aead80pq_init(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(uint8_t *)0x10440d);
  ascon_aead80pq_assoc_data_update(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0x104424);
  tag_00 = (uint8_t *)
           ascon_aead80pq_encrypt_update
                     (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                      (uint8_t *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
  ascon_aead80pq_encrypt_final
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,tag_00,
             (size_t)in_stack_ffffffffffffff68);
  return;
}

Assistant:

ASCON_API void
ascon_aead80pq_encrypt(uint8_t* ciphertext,
                       uint8_t* tag,
                       const uint8_t key[ASCON_AEAD80pq_KEY_LEN],
                       const uint8_t nonce[ASCON_AEAD_NONCE_LEN],
                       const uint8_t* assoc_data,
                       const uint8_t* plaintext,
                       size_t assoc_data_len,
                       size_t plaintext_len,
                       size_t tag_len)
{
    ASCON_ASSERT(plaintext_len == 0 || ciphertext != NULL);
    ASCON_ASSERT(tag_len != 0 || tag != NULL);
    ASCON_ASSERT(key != NULL);
    ASCON_ASSERT(nonce != NULL);
    ASCON_ASSERT(assoc_data_len == 0 || assoc_data != NULL);
    ASCON_ASSERT(plaintext_len == 0 || plaintext != NULL);
    ascon_aead_ctx_t ctx;
    ascon_aead80pq_init(&ctx, key, nonce);
    ascon_aead80pq_assoc_data_update(&ctx, assoc_data, assoc_data_len);
    const size_t new_ct_bytes = ascon_aead80pq_encrypt_update(&ctx, ciphertext,
                                                              plaintext,
                                                              plaintext_len);
    ascon_aead80pq_encrypt_final(&ctx, ciphertext + new_ct_bytes,
                                 tag, tag_len);
}